

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::WorkflowPresetsHelper
               (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_RCX;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  Object<cmCMakePresetsGraph::WorkflowPreset> local_60;
  
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_80[1] = (code *)0x0;
      local_80[0] = cmCMakePresetsErrors::INVALID_PRESETS;
      local_68 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::Object
                (&local_60,
                 (Object<cmCMakePresetsGraph::WorkflowPreset> *)
                 (anonymous_namespace)::WorkflowPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,(cmJSONHelperBuilder *)local_80,
                 (ErrorGenerator *)&local_60,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::~Object(&local_60);
      std::_Function_base::~_Function_base((_Function_base *)local_80);
      __cxa_atexit(std::_Function_base::~_Function_base,&WorkflowPresetsHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&WorkflowPresetsHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value, cmJSONState* state)
{
  static auto const helper = cmJSONHelperBuilder::Vector<WorkflowPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, WorkflowPresetHelper);

  return helper(out, value, state);
}